

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageDocsize(Fts5Storage *p,i64 iRowid,int *aCol)

{
  int iVar1;
  u8 *aBlob_00;
  bool bVar2;
  int nBlob;
  u8 *aBlob;
  int bCorrupt;
  int rc;
  sqlite3_stmt *pLookup;
  int *piStack_20;
  int nCol;
  int *aCol_local;
  i64 iRowid_local;
  Fts5Storage *p_local;
  
  pLookup._4_4_ = p->pConfig->nCol;
  _bCorrupt = (sqlite3_stmt *)0x0;
  piStack_20 = aCol;
  aCol_local = (int *)iRowid;
  iRowid_local = (i64)p;
  aBlob._4_4_ = fts5StorageGetStmt(p,8,(sqlite3_stmt **)&bCorrupt,(char **)0x0);
  if (aBlob._4_4_ == 0) {
    bVar2 = true;
    sqlite3_bind_int64(_bCorrupt,1,(sqlite_int64)aCol_local);
    iVar1 = sqlite3_step(_bCorrupt);
    if (iVar1 == 100) {
      aBlob_00 = (u8 *)sqlite3_column_blob(_bCorrupt,0);
      iVar1 = sqlite3_column_bytes(_bCorrupt,0);
      iVar1 = fts5StorageDecodeSizeArray(piStack_20,pLookup._4_4_,aBlob_00,iVar1);
      bVar2 = iVar1 != 0;
    }
    aBlob._4_4_ = sqlite3_reset(_bCorrupt);
    if ((bVar2) && (aBlob._4_4_ == 0)) {
      aBlob._4_4_ = 0x10b;
    }
  }
  return aBlob._4_4_;
}

Assistant:

static int sqlite3Fts5StorageDocsize(Fts5Storage *p, i64 iRowid, int *aCol){
  int nCol = p->pConfig->nCol;    /* Number of user columns in table */
  sqlite3_stmt *pLookup = 0;      /* Statement to query %_docsize */
  int rc;                         /* Return Code */

  assert( p->pConfig->bColumnsize );
  rc = fts5StorageGetStmt(p, FTS5_STMT_LOOKUP_DOCSIZE, &pLookup, 0);
  if( rc==SQLITE_OK ){
    int bCorrupt = 1;
    sqlite3_bind_int64(pLookup, 1, iRowid);
    if( SQLITE_ROW==sqlite3_step(pLookup) ){
      const u8 *aBlob = sqlite3_column_blob(pLookup, 0);
      int nBlob = sqlite3_column_bytes(pLookup, 0);
      if( 0==fts5StorageDecodeSizeArray(aCol, nCol, aBlob, nBlob) ){
        bCorrupt = 0;
      }
    }
    rc = sqlite3_reset(pLookup);
    if( bCorrupt && rc==SQLITE_OK ){
      rc = FTS5_CORRUPT;
    }
  }

  return rc;
}